

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

_Bool randart_file_exists(void)

{
  char *base;
  _Bool _Var1;
  char *leaf;
  char *local_420;
  char local_408 [8];
  char path [1024];
  
  base = ANGBAND_DIR_ARCHIVE;
  if (archive_user_pfx == (char *)0x0) {
    local_420 = "";
  }
  else {
    local_420 = archive_user_pfx;
  }
  leaf = format("%srandart_%08lx.txt",local_420,(ulong)seed_randart);
  path_build(local_408,0x400,base,leaf);
  _Var1 = file_exists(local_408);
  return _Var1;
}

Assistant:

bool randart_file_exists(void)
{
	char path[1024];

	/* Get the randart filename and path */
	path_build(path, sizeof(path), ANGBAND_DIR_ARCHIVE,
			   format("%srandart_%08lx.txt", (archive_user_pfx) ?
					archive_user_pfx : "",
					(unsigned long)seed_randart));
	return file_exists(path);
}